

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::GetExtensionList
          (BlenderImporter *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *app)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"blend",&local_31);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)app,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void BlenderImporter::GetExtensionList(std::set<std::string>& app)
{
    app.insert("blend");
}